

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.c
# Opt level: O1

void ecp_clear_precomputed(mbedtls_ecp_group *grp)

{
  ulong uVar1;
  long lVar2;
  
  if (grp->T != (mbedtls_ecp_point *)0x0) {
    if (grp->T_size != 0) {
      lVar2 = 0;
      uVar1 = 0;
      do {
        mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(grp->T->X).s + lVar2));
        uVar1 = uVar1 + 1;
        lVar2 = lVar2 + 0x48;
      } while (uVar1 < grp->T_size);
    }
    free(grp->T);
  }
  grp->T = (mbedtls_ecp_point *)0x0;
  grp->T_size = 0;
  return;
}

Assistant:

void ecp_clear_precomputed( mbedtls_ecp_group *grp )
{
    if( grp->T != NULL )
    {
        size_t i;
        for( i = 0; i < grp->T_size; i++ )
            mbedtls_ecp_point_free( &grp->T[i] );
        mbedtls_free( grp->T );
    }
    grp->T = NULL;
    grp->T_size = 0;
}